

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

ostream * pstack::operator<<(ostream *o,Escape *escape)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  ostream *poVar4;
  JSONEncodingError *pJVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  byte *pbVar10;
  uint uVar11;
  string local_58;
  undefined4 local_38;
  allocator<char> local_31;
  
  local_38 = *(undefined4 *)(o + *(long *)(*(long *)o + -0x18) + 0x18);
  pbVar3 = (byte *)(escape->value)._M_dataplus._M_p;
  pbVar10 = pbVar3;
  do {
    if (pbVar10 == pbVar3 + (escape->value)._M_string_length) {
      *(undefined4 *)(o + *(long *)(*(long *)o + -0x18) + 0x18) = local_38;
      return o;
    }
    bVar1 = *pbVar10;
    uVar11 = (uint)bVar1;
    pbVar10 = pbVar10 + 1;
    switch(bVar1) {
    case 8:
      pcVar9 = "\\b";
      break;
    case 9:
      pcVar9 = "\\t";
      break;
    case 10:
      pcVar9 = "\\n";
      break;
    case 0xb:
switchD_00130b8a_caseD_b:
      if (bVar1 < 0x20) {
        poVar4 = std::operator<<(o,"\\u");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
LAB_00130cce:
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      }
      else {
        if ((char)bVar1 < '\0') {
          uVar6 = 0x80;
          iVar7 = 0;
          iVar2 = 1;
          for (; (uVar11 & uVar6) != 0; uVar11 = uVar11 & uVar8) {
            if (iVar7 == 8) {
              pJVar5 = (JSONEncodingError *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_58,"malformed UTF-8 string",&local_31);
              JSONEncodingError::JSONEncodingError(pJVar5,&local_58);
              __cxa_throw(pJVar5,&JSONEncodingError::typeinfo,JSONEncodingError::~JSONEncodingError)
              ;
            }
            iVar7 = iVar7 + 1;
            uVar8 = ~uVar6;
            uVar6 = uVar6 >> 1;
            iVar2 = iVar2 + -1;
          }
          for (; iVar2 != 0; iVar2 = iVar2 + 1) {
            if ((*pbVar10 & 0xc0) != 0x80) {
              pJVar5 = (JSONEncodingError *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_58,"illegal character in multibyte sequence",&local_31);
              JSONEncodingError::JSONEncodingError(pJVar5,&local_58);
              __cxa_throw(pJVar5,&JSONEncodingError::typeinfo,JSONEncodingError::~JSONEncodingError)
              ;
            }
            pbVar10 = pbVar10 + 1;
          }
          poVar4 = std::operator<<(o,"\\u");
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar4 = std::operator<<(poVar4,0x30);
          *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
          goto LAB_00130cce;
        }
        std::operator<<(o,bVar1);
      }
      goto LAB_00130c21;
    case 0xc:
      pcVar9 = "\\f";
      break;
    case 0xd:
      pcVar9 = "\\r";
      break;
    default:
      if (bVar1 == 0x22) {
        pcVar9 = "\\\"";
      }
      else {
        if (bVar1 != 0x5c) goto switchD_00130b8a_caseD_b;
        pcVar9 = "\\\\";
      }
    }
    std::operator<<(o,pcVar9);
LAB_00130c21:
    pbVar3 = (byte *)(escape->value)._M_dataplus._M_p;
  } while( true );
}

Assistant:

inline std::ostream & operator << (std::ostream &o, const Escape &escape)
{
    auto flags(o.flags());
    for (auto i = escape.value.begin(); i != escape.value.end();) {
        int c;
        switch (c = (unsigned char)*i++) {
            case '\b': o << "\\b"; break;
            case '\f': o << "\\f"; break;
            case '\n': o << "\\n"; break;
            case '"': o << "\\\""; break;
            case '\\': o << "\\\\"; break;
            case '\r': o << "\\r"; break;
            case '\t': o << "\\t"; break;
            default:
                if (unsigned(c) < 32) {
                    o << "\\u" << std::hex << unsigned(c);
                } else if (c & 0x80) {
                    // multibyte UTF-8: build up the unicode codepoint.
                    unsigned long v = c;
                    int count = 0;
                    for (int mask = 0x80; mask & v; mask >>= 1) {
                        if (mask == 0)
                            throw JSONEncodingError("malformed UTF-8 string");
                        count++;
                        v &= ~mask;
                    }
                    while (--count) {
                        c = (unsigned char)*i++;
                        if ((c & 0xc0) != 0x80)
                            throw JSONEncodingError("illegal character in multibyte sequence");
                        v = (v << 6) | (c & 0x3f);
                    }
                    o << "\\u" << std::hex << std::setfill('0') << std::setw(4) << v;
                } else {
                    o << (char)c;
                }
                break;
        }
    }
    o.flags(flags);
    return o;
}